

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O0

void __thiscall pstore::broker::gc_watch_thread::watcher(gc_watch_thread *this)

{
  uint *puVar1;
  right_iterator __first;
  right_iterator __last;
  int errnum;
  double __x;
  double __x_00;
  double __x_01;
  not_null<const_char_*> local_a8 [2];
  exception *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string *db_path;
  uint local_48;
  __pid_t local_44;
  int err;
  __pid_t pid;
  int status;
  not_null<const_char_*> local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  gc_watch_thread *this_local;
  
  gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)&lock._M_owns,"starting gc process watch thread");
  pstore::log((pstore *)0x6,__x);
  register_signal_handler(0x11,child_signal);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mut_);
  do {
    gsl::not_null<const_char_*>::not_null(&local_30,"waiting for a GC process to complete");
    pstore::log((pstore *)0x6,__x_00);
    signal_cv::wait(&this->cv_,local_28);
    if ((this->done_ & 1U) != 0) {
      gsl::not_null<const_char_*>::not_null(local_a8,"cleaning up");
      pstore::log((pstore *)0x6,__x_01);
      __first = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
                ::right_begin(&this->processes_);
      __last = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
               ::right_end(&this->processes_);
      std::
      for_each<pstore::broker::bimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::less<int>>::iterator<std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string_const*>>>,pstore::broker::gc_watch_thread::watcher()::__0>
                ((iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  )__first.it_._M_node,
                 (iterator<std::_Rb_tree_const_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  )__last.it_._M_node,(anon_class_8_1_8991fb9c)this);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
      return;
    }
    err = 0;
    while (local_44 = waitpid(-1,&err,3), local_44 != 0) {
      if (local_44 == -1) {
        puVar1 = (uint *)__errno_location();
        local_48 = *puVar1;
        if (local_48 != 10) {
          (anonymous_namespace)::string_error_abi_cxx11_
                    ((string *)&db_path,(_anonymous_namespace_ *)(ulong)local_48,errnum);
          log<std::__cxx11::string>
                    (error,"waitpid error: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db_path);
          std::__cxx11::string::~string((string *)&db_path);
        }
        break;
      }
      local_70 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
                 ::getl(&this->processes_,&local_44);
      std::__cxx11::string::string((string *)&local_90,(string *)local_70);
      log<std::__cxx11::string>(info,"GC exited for ",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      anon_unknown.dwarf_11456c::pr_exit(local_44,err);
      bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
      ::eraser<int>(&this->processes_,&local_44);
    }
  } while( true );
}

Assistant:

void gc_watch_thread::watcher () {
            log (priority::info, "starting gc process watch thread");

            // Installing a global signal handler here is really somewhat antisocial. It would
            // overwrite a similar handler from another part of the system and it continues to be
            // active once this function returns.
            //
            // However, I'm comfortable enough with it at the moment that a more complex solution
            // is unnessary.
            register_signal_handler (SIGCHLD, &child_signal);

            std::unique_lock<decltype (mut_)> lock (mut_);
            for (;;) {
                try {
                    log (priority::info, "waiting for a GC process to complete");
                    cv_.wait (lock);
                    // There are two reasons that we may have been woken:
                    // - One (or more) of our child processes may have exited.
                    // - The program is exiting.
                    if (done_) {
                        break;
                    }

                    // Loop to ensure that we query all processes that exited whilst we were
                    // waiting.
                    auto status = 0;
                    while (auto const pid = ::waitpid (-1, &status, WUNTRACED | WNOHANG)) {
                        if (pid == -1) {
                            int const err = errno;
                            // If the error was "no child processes", we shouldn't report it.
                            if (err != ECHILD) {
                                log (priority::error, "waitpid error: ", string_error (err));
                            }
                            break;
                        }

                        std::string const & db_path = processes_.getl (pid);
                        log (priority::info, "GC exited for ", db_path);
                        // TODO: push a message to a channel which will tell a listener that this GC
                        // process has exited (and why)

                        pr_exit (pid, status); // Log the process exit.

                        processes_.eraser (pid); // Forget about the process.
                    }
                } catch (std::exception const & ex) {
                    log (priority::error, "An error occurred: ", ex.what ());
                    // TODO: delay before restarting. Don't restart after e.g. bad_alloc?
                } catch (...) {
                    log (priority::error, "Unknown error");
                    // TODO: delay before restarting
                }
            }

            // Ask any child GC processes to quit.
            log (priority::info, "cleaning up");
            std::for_each (processes_.right_begin (), processes_.right_end (),
                           [this] (pid_t const pid) { this->kill (pid); });
        }